

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeHex(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
             ArrayPtr<const_char> text)

{
  kj kVar1;
  uchar *puVar2;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  byte bVar6;
  ulong elementCount;
  
  pcVar4 = text.ptr;
  elementCount = (ulong)pcVar4 >> 1;
  puVar2 = (uchar *)_::HeapArrayDisposer::allocateImpl
                              (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  if ((char *)0x1 < pcVar4) {
    uVar3 = 0;
    do {
      kVar1 = this[uVar3 * 2];
      bVar5 = (char)kVar1 - 0x30;
      if (bVar5 < 10) {
LAB_0028a2d0:
        bVar5 = bVar5 << 4;
      }
      else {
        if ((byte)((char)kVar1 + 0x9fU) < 6) {
          bVar5 = (char)kVar1 + 0xa9;
          goto LAB_0028a2d0;
        }
        if ((byte)((char)kVar1 + 0xbfU) < 6) {
          bVar5 = (char)kVar1 - 0x37;
          goto LAB_0028a2d0;
        }
        pcVar4 = (char *)0x1;
        bVar5 = 0;
      }
      kVar1 = this[uVar3 * 2 + 1];
      bVar6 = (char)kVar1 - 0x30;
      if (bVar6 < 10) {
LAB_0028a2ff:
        bVar5 = bVar6 | bVar5;
      }
      else {
        if ((byte)((char)kVar1 + 0x9fU) < 6) {
          bVar6 = (char)kVar1 + 0xa9;
          goto LAB_0028a2ff;
        }
        if ((byte)((char)kVar1 + 0xbfU) < 6) {
          bVar6 = (char)kVar1 - 0x37;
          goto LAB_0028a2ff;
        }
        pcVar4 = (char *)0x1;
      }
      puVar2[uVar3] = bVar5;
      uVar3 = uVar3 + 1;
    } while (elementCount != uVar3);
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = puVar2;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ = elementCount;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer =
       (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __return_storage_ptr__->hadErrors = (bool)((byte)pcVar4 & 1);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeHex(ArrayPtr<const char> text) {
  auto result = heapArray<byte>(text.size() / 2);
  bool hadErrors = text.size() % 2;

  for (auto i: kj::indices(result)) {
    byte b = 0;
    KJ_IF_SOME(d1, tryFromHexDigit(text[i*2])) {
      b = d1 << 4;
    } else {
      hadErrors = true;
    }
    KJ_IF_SOME(d2, tryFromHexDigit(text[i*2+1])) {
      b |= d2;
    } else {
      hadErrors = true;
    }